

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::JulianDayFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  FunctionNullHandling in_stack_fffffffffffffc88;
  bind_lambda_function_t in_stack_fffffffffffffc90;
  LogicalType local_368;
  scalar_function_t local_350;
  scalar_function_t local_330;
  LogicalType local_310;
  vector<duckdb::LogicalType,_true> local_2f8;
  LogicalType local_2e0;
  vector<duckdb::LogicalType,_true> local_2c8;
  LogicalType local_2b0;
  LogicalType local_298;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_368,DATE);
  __l._M_len = 1;
  __l._M_array = &local_368;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c8,__l,
             (allocator_type *)&stack0xfffffffffffffc97);
  LogicalType::LogicalType(&local_2e0,DOUBLE);
  local_330.super__Function_base._M_functor._8_8_ = 0;
  local_330.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::date_t,double,duckdb::DatePart::JulianDayOperator>;
  local_330._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_330.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_298,INVALID);
  ScalarFunction::ScalarFunction
            (&local_158,&local_2c8,&local_2e0,&local_330,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             DatePart::JulianDayOperator::PropagateStatistics<duckdb::date_t>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_298),CONSISTENT,
             in_stack_fffffffffffffc88,in_stack_fffffffffffffc90);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_298);
  if (local_330.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.super__Function_base._M_manager)
              ((_Any_data *)&local_330,(_Any_data *)&local_330,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_2e0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c8);
  LogicalType::~LogicalType(&local_368);
  LogicalType::LogicalType(&local_368,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = &local_368;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8,__l_00,
             (allocator_type *)&stack0xfffffffffffffc97);
  LogicalType::LogicalType(&local_310,DOUBLE);
  local_350.super__Function_base._M_functor._8_8_ = 0;
  local_350.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::timestamp_t,double,duckdb::DatePart::JulianDayOperator>;
  local_350._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_350.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2b0,INVALID);
  ScalarFunction::ScalarFunction
            (&local_280,&local_2f8,&local_310,&local_350,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             DatePart::JulianDayOperator::PropagateStatistics<duckdb::timestamp_t>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_2b0),CONSISTENT,
             in_stack_fffffffffffffc88,in_stack_fffffffffffffc90);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2b0);
  if (local_350.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_350.super__Function_base._M_manager)
              ((_Any_data *)&local_350,(_Any_data *)&local_350,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_310);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8);
  LogicalType::~LogicalType(&local_368);
  return in_RDI;
}

Assistant:

ScalarFunctionSet JulianDayFun::GetFunctions() {
	using OP = DatePart::JulianDayOperator;

	ScalarFunctionSet operator_set;
	auto date_func = DatePart::UnaryFunction<date_t, double, OP>;
	auto date_stats = OP::template PropagateStatistics<date_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::DATE}, LogicalType::DOUBLE, date_func, nullptr, nullptr, date_stats));
	auto ts_func = DatePart::UnaryFunction<timestamp_t, double, OP>;
	auto ts_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::DOUBLE, ts_func, nullptr, nullptr, ts_stats));

	return operator_set;
}